

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void prepare_coeffs_lowbd(InterpFilterParams *filter_params,int subpel_q4,__m256i *coeffs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 (*in_RDX) [32];
  uint in_ESI;
  InterpFilterParams *in_RDI;
  undefined1 auVar9 [16];
  __m256i coeffs_1;
  __m256i filter_coeffs;
  __m128i coeffs_8;
  int16_t *filter;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined4 uStack_168;
  undefined4 local_164;
  
  av1_get_interp_filter_subpel_kernel(in_RDI,in_ESI & 0xf);
  auVar3._8_8_ = CONCAT44(local_164,uStack_168);
  auVar3._0_8_ = uStack_170;
  auVar3._16_8_ = uStack_170;
  auVar3._24_8_ = CONCAT44(local_164,uStack_168);
  auVar4 = vpsraw_avx2(auVar3,ZEXT416(1));
  auVar1 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar1 = vpinsrw_avx(auVar1,0x200,2);
  auVar1 = vpinsrw_avx(auVar1,0x200,3);
  auVar1 = vpinsrw_avx(auVar1,0x200,4);
  auVar1 = vpinsrw_avx(auVar1,0x200,5);
  auVar1 = vpinsrw_avx(auVar1,0x200,6);
  auVar1 = vpinsrw_avx(auVar1,0x200,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar2 = vpinsrw_avx(auVar2,0x200,2);
  auVar2 = vpinsrw_avx(auVar2,0x200,3);
  auVar2 = vpinsrw_avx(auVar2,0x200,4);
  auVar2 = vpinsrw_avx(auVar2,0x200,5);
  auVar2 = vpinsrw_avx(auVar2,0x200,6);
  auVar2 = vpinsrw_avx(auVar2,0x200,7);
  uStack_270 = auVar2._0_8_;
  uStack_268 = auVar2._8_8_;
  auVar8._16_8_ = uStack_270;
  auVar8._0_16_ = auVar1;
  auVar8._24_8_ = uStack_268;
  auVar3 = vpshufb_avx2(auVar4,auVar8);
  *in_RDX = auVar3;
  auVar1 = vpinsrw_avx(ZEXT216(0x604),0x604,1);
  auVar1 = vpinsrw_avx(auVar1,0x604,2);
  auVar1 = vpinsrw_avx(auVar1,0x604,3);
  auVar1 = vpinsrw_avx(auVar1,0x604,4);
  auVar1 = vpinsrw_avx(auVar1,0x604,5);
  auVar1 = vpinsrw_avx(auVar1,0x604,6);
  auVar1 = vpinsrw_avx(auVar1,0x604,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x604),0x604,1);
  auVar2 = vpinsrw_avx(auVar2,0x604,2);
  auVar2 = vpinsrw_avx(auVar2,0x604,3);
  auVar2 = vpinsrw_avx(auVar2,0x604,4);
  auVar2 = vpinsrw_avx(auVar2,0x604,5);
  auVar2 = vpinsrw_avx(auVar2,0x604,6);
  auVar2 = vpinsrw_avx(auVar2,0x604,7);
  uStack_230 = auVar2._0_8_;
  uStack_228 = auVar2._8_8_;
  auVar7._16_8_ = uStack_230;
  auVar7._0_16_ = auVar1;
  auVar7._24_8_ = uStack_228;
  auVar3 = vpshufb_avx2(auVar4,auVar7);
  in_RDX[1] = auVar3;
  auVar1 = vpinsrw_avx(ZEXT216(0xa08),0xa08,1);
  auVar1 = vpinsrw_avx(auVar1,0xa08,2);
  auVar1 = vpinsrw_avx(auVar1,0xa08,3);
  auVar1 = vpinsrw_avx(auVar1,0xa08,4);
  auVar1 = vpinsrw_avx(auVar1,0xa08,5);
  auVar1 = vpinsrw_avx(auVar1,0xa08,6);
  auVar1 = vpinsrw_avx(auVar1,0xa08,7);
  auVar2 = vpinsrw_avx(ZEXT216(0xa08),0xa08,1);
  auVar2 = vpinsrw_avx(auVar2,0xa08,2);
  auVar2 = vpinsrw_avx(auVar2,0xa08,3);
  auVar2 = vpinsrw_avx(auVar2,0xa08,4);
  auVar2 = vpinsrw_avx(auVar2,0xa08,5);
  auVar2 = vpinsrw_avx(auVar2,0xa08,6);
  auVar2 = vpinsrw_avx(auVar2,0xa08,7);
  uStack_1f0 = auVar2._0_8_;
  uStack_1e8 = auVar2._8_8_;
  auVar6._16_8_ = uStack_1f0;
  auVar6._0_16_ = auVar1;
  auVar6._24_8_ = uStack_1e8;
  auVar3 = vpshufb_avx2(auVar4,auVar6);
  in_RDX[2] = auVar3;
  auVar1 = vpinsrw_avx(ZEXT216(0xe0c),0xe0c,1);
  auVar1 = vpinsrw_avx(auVar1,0xe0c,2);
  auVar1 = vpinsrw_avx(auVar1,0xe0c,3);
  auVar1 = vpinsrw_avx(auVar1,0xe0c,4);
  auVar1 = vpinsrw_avx(auVar1,0xe0c,5);
  auVar1 = vpinsrw_avx(auVar1,0xe0c,6);
  auVar1 = vpinsrw_avx(auVar1,0xe0c,7);
  auVar2 = vpinsrw_avx(ZEXT216(0xe0c),0xe0c,1);
  auVar2 = vpinsrw_avx(auVar2,0xe0c,2);
  auVar2 = vpinsrw_avx(auVar2,0xe0c,3);
  auVar2 = vpinsrw_avx(auVar2,0xe0c,4);
  auVar2 = vpinsrw_avx(auVar2,0xe0c,5);
  auVar2 = vpinsrw_avx(auVar2,0xe0c,6);
  auVar2 = vpinsrw_avx(auVar2,0xe0c,7);
  auVar9 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_1b0 = auVar9._0_8_;
  uStack_1a8 = auVar9._8_8_;
  auVar5._16_8_ = uStack_1b0;
  auVar5._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar5._24_8_ = uStack_1a8;
  auVar3 = vpshufb_avx2(auVar4,auVar5);
  in_RDX[3] = auVar3;
  return;
}

Assistant:

static inline void prepare_coeffs_lowbd(
    const InterpFilterParams *const filter_params, const int subpel_q4,
    __m256i *const coeffs /* [4] */) {
  const int16_t *const filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);
  const __m128i coeffs_8 = _mm_loadu_si128((__m128i *)filter);
  const __m256i filter_coeffs = _mm256_broadcastsi128_si256(coeffs_8);

  // right shift all filter co-efficients by 1 to reduce the bits required.
  // This extra right shift will be taken care of at the end while rounding
  // the result.
  // Since all filter co-efficients are even, this change will not affect the
  // end result
  assert(_mm_test_all_zeros(_mm_and_si128(coeffs_8, _mm_set1_epi16(1)),
                            _mm_set1_epi16((short)0xffff)));

  const __m256i coeffs_1 = _mm256_srai_epi16(filter_coeffs, 1);

  // coeffs 0 1 0 1 0 1 0 1
  coeffs[0] = _mm256_shuffle_epi8(coeffs_1, _mm256_set1_epi16(0x0200u));
  // coeffs 2 3 2 3 2 3 2 3
  coeffs[1] = _mm256_shuffle_epi8(coeffs_1, _mm256_set1_epi16(0x0604u));
  // coeffs 4 5 4 5 4 5 4 5
  coeffs[2] = _mm256_shuffle_epi8(coeffs_1, _mm256_set1_epi16(0x0a08u));
  // coeffs 6 7 6 7 6 7 6 7
  coeffs[3] = _mm256_shuffle_epi8(coeffs_1, _mm256_set1_epi16(0x0e0cu));
}